

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

void __thiscall
cs_impl::any::holder<cs::callable>::
holder<cs_impl::any(&)(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)>
          (holder<cs::callable> *this,
          _func_any_vector<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *args)

{
  _Any_data local_20;
  undefined8 local_10;
  undefined8 uStack_8;
  
  (this->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_00249628;
  local_20._8_8_ = 0;
  (this->mDat).mFunc._M_invoker =
       std::
       _Function_handler<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs_impl::any_(*)(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
       ::_M_invoke;
  *(_func_any_vector<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr **)
   &(this->mDat).mFunc.super__Function_base._M_functor = args;
  *(undefined8 *)((long)&(this->mDat).mFunc.super__Function_base._M_functor + 8) = 0;
  (this->mDat).mFunc.super__Function_base._M_manager =
       std::
       _Function_handler<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs_impl::any_(*)(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
       ::_M_manager;
  local_10 = 0;
  uStack_8 = 0;
  (this->mDat).mType = normal;
  local_20._M_unused._0_8_ = (undefined8)args;
  std::_Function_base::~_Function_base((_Function_base *)&local_20);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}